

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyDrawMeshAttribs(MeshShaderProperties *MeshShaderProps,DrawMeshAttribs *Attribs)

{
  Uint32 *Args_1;
  uint uVar1;
  string _msg;
  Uint64 TotalGroups;
  
  if (Attribs->ThreadGroupCountX == 0) {
    FormatString<char[114]>
              (&_msg,(char (*) [114])
                     "DrawMeshAttribs.ThreadGroupCountX is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  if (Attribs->ThreadGroupCountY == 0) {
    FormatString<char[114]>
              (&_msg,(char (*) [114])
                     "DrawMeshAttribs.ThreadGroupCountY is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  if (Attribs->ThreadGroupCountZ == 0) {
    FormatString<char[114]>
              (&_msg,(char (*) [114])
                     "DrawMeshAttribs.ThreadGroupCountZ is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  if (MeshShaderProps->MaxThreadGroupCountX < Attribs->ThreadGroupCountX) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              (&_msg,(Diligent *)"Draw mesh attribs are invalid: ",(char (*) [32])0x2e2abb,
               (char (*) [20])Attribs,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountX (",
               (char (*) [57])MeshShaderProps,(uint *)0x2ed6c5,(char (*) [3])_msg._M_dataplus._M_p);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)&_msg);
  }
  if (MeshShaderProps->MaxThreadGroupCountY < Attribs->ThreadGroupCountY) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              (&_msg,(Diligent *)"Draw mesh attribs are invalid: ",(char (*) [32])0x2e2b0a,
               (char (*) [20])&Attribs->ThreadGroupCountY,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountY (",
               (char (*) [57])&MeshShaderProps->MaxThreadGroupCountY,(uint *)0x2ed6c5,
               (char (*) [3])_msg._M_dataplus._M_p);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x60);
    std::__cxx11::string::~string((string *)&_msg);
  }
  Args_1 = &Attribs->ThreadGroupCountZ;
  uVar1 = *Args_1;
  if (MeshShaderProps->MaxThreadGroupCountZ < uVar1) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              (&_msg,(Diligent *)"Draw mesh attribs are invalid: ",(char (*) [32])0x2e2b43,
               (char (*) [20])Args_1,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountZ (",
               (char (*) [57])&MeshShaderProps->MaxThreadGroupCountZ,(uint *)0x2ed6c5,
               (char (*) [3])_msg._M_dataplus._M_p);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,99);
    std::__cxx11::string::~string((string *)&_msg);
    uVar1 = *Args_1;
  }
  TotalGroups = (ulong)uVar1 * (ulong)Attribs->ThreadGroupCountY * (ulong)Attribs->ThreadGroupCountX
  ;
  if (MeshShaderProps->MaxThreadGroupTotalCount <= TotalGroups &&
      TotalGroups - MeshShaderProps->MaxThreadGroupTotalCount != 0) {
    FormatString<char[32],char[27],unsigned_long,char[61],unsigned_int,char[3]>
              (&_msg,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])"Total thread group count (",(char (*) [27])&TotalGroups,
               (unsigned_long *)") must not exceed MeshShaderProps.MaxThreadGroupTotalCount (",
               (char (*) [61])&MeshShaderProps->MaxThreadGroupTotalCount,(uint *)0x2ed6c5,
               (char (*) [3])_msg._M_dataplus._M_p);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x68);
    std::__cxx11::string::~string((string *)&_msg);
  }
  return true;
}

Assistant:

bool VerifyDrawMeshAttribs(const MeshShaderProperties& MeshShaderProps, const DrawMeshAttribs& Attribs)
{
#define CHECK_DRAW_MESH_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw mesh attribs are invalid: ", __VA_ARGS__)

    if (Attribs.ThreadGroupCountX == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountX is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountY == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountY is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountZ == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountZ is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountX <= MeshShaderProps.MaxThreadGroupCountX,
                            "ThreadGroupCountX (", Attribs.ThreadGroupCountX, ") must not exceed MeshShaderProps.MaxThreadGroupCountX (",
                            MeshShaderProps.MaxThreadGroupCountX, ").");
    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountY <= MeshShaderProps.MaxThreadGroupCountY,
                            "ThreadGroupCountY (", Attribs.ThreadGroupCountY, ") must not exceed MeshShaderProps.MaxThreadGroupCountY (",
                            MeshShaderProps.MaxThreadGroupCountY, ").");
    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountZ <= MeshShaderProps.MaxThreadGroupCountZ,
                            "ThreadGroupCountZ (", Attribs.ThreadGroupCountZ, ") must not exceed MeshShaderProps.MaxThreadGroupCountZ (",
                            MeshShaderProps.MaxThreadGroupCountZ, ").");

    const Uint64 TotalGroups = Uint64{Attribs.ThreadGroupCountX} * Uint64{Attribs.ThreadGroupCountY} * Uint64{Attribs.ThreadGroupCountZ};
    CHECK_DRAW_MESH_ATTRIBS(TotalGroups <= MeshShaderProps.MaxThreadGroupTotalCount,
                            "Total thread group count (", TotalGroups, ") must not exceed MeshShaderProps.MaxThreadGroupTotalCount (",
                            MeshShaderProps.MaxThreadGroupTotalCount, ").");

#undef CHECK_DRAW_MESH_ATTRIBS

    return true;
}